

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signalhandler.cc
# Opt level: O1

bool google::glog_internal_namespace_::IsFailureSignalHandlerInstalled(void)

{
  sigaction sig_action;
  _union_1457 local_a8;
  sigset_t local_a0;
  
  memset(&local_a8,0,0x98);
  sigemptyset(&local_a0);
  sigaction(6,(sigaction *)0x0,(sigaction *)&local_a8);
  return local_a8.sa_handler == anon_unknown_0::FailureSignalHandler;
}

Assistant:

bool IsFailureSignalHandlerInstalled() {
#ifdef HAVE_SIGACTION
  // TODO(andschwa): Return kFailureSignalHandlerInstalled?
  struct sigaction sig_action;
  memset(&sig_action, 0, sizeof(sig_action));
  sigemptyset(&sig_action.sa_mask);
  sigaction(SIGABRT, NULL, &sig_action);
  if (sig_action.sa_sigaction == &FailureSignalHandler)
    return true;
#elif defined(OS_WINDOWS)
  return kFailureSignalHandlerInstalled;
#endif  // HAVE_SIGACTION
  return false;
}